

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall Lib::Array<bool>::expandToFit(Array<bool> *this,size_t n)

{
  bool *pbVar1;
  bool *__s;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t __n;
  bool *res;
  bool bVar5;
  
  uVar4 = this->_capacity * 2;
  __n = n + 1;
  if (n < uVar4) {
    __n = uVar4;
  }
  uVar4 = __n + 0xf & 0xfffffffffffffff0;
  if (uVar4 == 0) {
    __s = (bool *)FixedSizeAllocator<8UL>::alloc
                            ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x11) {
    __s = (bool *)FixedSizeAllocator<16UL>::alloc
                            ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar4 < 0x19) {
    __s = (bool *)FixedSizeAllocator<24UL>::alloc
                            ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar4 < 0x21) {
    __s = (bool *)FixedSizeAllocator<32UL>::alloc
                            ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar4 < 0x31) {
    __s = (bool *)FixedSizeAllocator<48UL>::alloc
                            ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar4 < 0x41) {
    __s = (bool *)FixedSizeAllocator<64UL>::alloc
                            ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    __s = (bool *)::operator_new(uVar4,0x10);
  }
  if (__n != 0) {
    memset(__s,0,__n);
  }
  sVar3 = this->_capacity;
  if ((sVar3 != 0) && (uVar2 = (int)sVar3 - 1, -1 < (int)uVar2)) {
    pbVar1 = this->_array;
    uVar4 = (ulong)uVar2;
    do {
      __s[uVar4] = pbVar1[uVar4];
      bVar5 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar5);
  }
  pbVar1 = this->_array;
  if (pbVar1 != (bool *)0x0) {
    uVar4 = sVar3 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      *(undefined8 *)pbVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pbVar1;
    }
    else if (uVar4 < 0x11) {
      *(undefined8 *)pbVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pbVar1;
    }
    else if (uVar4 < 0x19) {
      *(undefined8 *)pbVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pbVar1;
    }
    else if (uVar4 < 0x21) {
      *(undefined8 *)pbVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pbVar1;
    }
    else if (uVar4 < 0x31) {
      *(undefined8 *)pbVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pbVar1;
    }
    else if (uVar4 < 0x41) {
      *(undefined8 *)pbVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pbVar1;
    }
    else {
      operator_delete(pbVar1,0x10);
      sVar3 = this->_capacity;
    }
  }
  this->_array = __s;
  (**this->_vptr_Array)(this,sVar3,__n);
  this->_capacity = __n;
  return;
}

Assistant:

void expandToFit (size_t n)
  {
    ASS(n >= _capacity);

    // determine new capacity (at least double the old one)
    size_t newCapacity = 2 * _capacity;
    if (newCapacity <= n) {
      newCapacity = n+1;
    }

    // allocate new array and copy old array's content to the new place
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"Array<>");
    C* newArray = array_new<C>(mem, newCapacity);
    if(_capacity) {
      for (int i = _capacity-1;i >= 0;i--) {
	newArray[i] = _array[i];
      }
    }

    if(_array) {
      // deallocate the old array
      array_delete(_array,_capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }

    _array = newArray;
    fillInterval(_capacity,newCapacity);
    _capacity = newCapacity;
  }